

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void av1_loop_restoration_filter_unit
               (RestorationTileLimits *limits,RestorationUnitInfo *rui,
               RestorationStripeBoundaries *rsb,RestorationLineBuffers *rlbs,int plane_w,int plane_h
               ,int ss_x,int ss_y,int highbd,int bit_depth,uint8_t *data8,int stride,uint8_t *dst8,
               int dst_stride,int32_t *tmpbuf,int optimized_lr,aom_internal_error_info *error_info)

{
  int iVar1;
  int iVar2;
  stripe_filter_fun p_Var3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  int iVar10;
  size_t __n;
  int iVar11;
  int iVar12;
  uint8_t *puVar13;
  long lVar14;
  uint8_t *__dest;
  void *__dest_00;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  uint8_t *puVar20;
  uint uVar21;
  uint8_t *puVar22;
  long lVar23;
  long lVar24;
  uint8_t *puVar25;
  int iVar26;
  size_t __n_00;
  long lVar27;
  ulong uVar28;
  uint8_t *local_138;
  
  iVar1 = limits->v_end;
  iVar11 = limits->v_start;
  uVar21 = iVar1 - iVar11;
  iVar2 = limits->h_start;
  lVar23 = (long)stride;
  local_138 = data8 + (long)iVar2 + iVar11 * lVar23;
  iVar10 = limits->h_end - iVar2;
  lVar24 = (long)dst_stride;
  __dest = dst8 + (long)iVar2 + iVar11 * lVar24;
  if (rui->restoration_type == RESTORE_NONE) {
    if (highbd == 0) {
      if (0 < (int)uVar21) {
        uVar28 = (ulong)uVar21;
        do {
          memcpy(__dest,local_138,(long)iVar10);
          local_138 = local_138 + lVar23;
          __dest = __dest + lVar24;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
    }
    else if (0 < (int)uVar21) {
      local_138 = (uint8_t *)((long)local_138 * 2);
      __dest_00 = (void *)((long)__dest * 2);
      uVar28 = (ulong)uVar21;
      do {
        memcpy(__dest_00,local_138,(long)iVar10 * 2);
        local_138 = (uint8_t *)((long)local_138 + lVar23 * 2);
        __dest_00 = (void *)((long)__dest_00 + lVar24 * 2);
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
    }
  }
  else if (0 < (int)uVar21) {
    uVar15 = 0x40 >> ((byte)ss_y & 0x1f);
    uVar16 = 8 >> ((byte)ss_y & 0x1f);
    p_Var3 = stripe_filters[(int)((uint)(rui->restoration_type == RESTORE_SGRPROJ) + highbd * 2)];
    bVar9 = (byte)highbd;
    lVar18 = (long)(iVar2 + -4);
    __n_00 = (size_t)(iVar10 + 8 << (bVar9 & 0x1f));
    lVar19 = lVar18 + lVar23 * -3;
    lVar5 = lVar23 * -3 + lVar18;
    __n = (size_t)(iVar10 + 8 << (bVar9 & 0x1f));
    lVar24 = lVar23 * 2;
    iVar11 = 0 << (bVar9 & 0x1f);
    do {
      iVar17 = limits->v_start + iVar11;
      uVar6 = 0;
      if (iVar17 == 0) {
        uVar6 = uVar16;
      }
      iVar12 = (iVar17 + uVar15) - uVar6;
      iVar7 = (int)(iVar17 + uVar16) / (int)uVar15;
      uVar6 = 0;
      if (iVar7 == 0) {
        uVar6 = uVar16;
      }
      iVar4 = iVar1 - iVar17;
      if ((int)(uVar15 - uVar6) < iVar1 - iVar17) {
        iVar4 = uVar15 - uVar6;
      }
      if (optimized_lr == 0) {
        uVar6 = iVar7 * 2;
        iVar7 = rsb->stripe_boundary_stride;
        if (iVar17 != 0) {
          puVar25 = data8 + iVar17 * stride + lVar19;
          puVar13 = (uint8_t *)((long)(data8 + iVar17 * stride + lVar5) * 2);
          iVar26 = -3;
          lVar27 = 0;
          do {
            iVar8 = -2;
            if (-2 < iVar26) {
              iVar8 = iVar26;
            }
            puVar20 = rsb->stripe_boundary_above;
            puVar22 = puVar13;
            if (highbd == 0) {
              puVar22 = puVar25;
            }
            memcpy((void *)((long)rlbs->tmp_save_above[0] + lVar27),puVar22,__n_00);
            memcpy(puVar22,puVar20 + (int)((iVar8 + uVar6 + 2) * iVar7 + iVar2 << (bVar9 & 0x1f)),
                   __n_00);
            lVar27 = lVar27 + 0x310;
            puVar25 = puVar25 + lVar23;
            puVar13 = puVar13 + lVar24;
            iVar26 = iVar26 + 1;
          } while (lVar27 != 0x930);
        }
        if (iVar12 < plane_h) {
          lVar27 = (long)((iVar4 + iVar17) * stride);
          puVar25 = data8 + lVar27 + lVar18;
          puVar13 = (uint8_t *)((long)(data8 + lVar27 + lVar18) * 2);
          lVar27 = 0;
          do {
            puVar20 = rsb->stripe_boundary_below;
            puVar22 = puVar13;
            if (highbd == 0) {
              puVar22 = puVar25;
            }
            memcpy((void *)((long)rlbs->tmp_save_below[0] + lVar27),puVar22,__n_00);
            memcpy(puVar22,puVar20 + (int)((lVar27 != 0 | uVar6) * iVar7 + iVar2 << (bVar9 & 0x1f)),
                   __n_00);
            lVar27 = lVar27 + 0x310;
            puVar25 = puVar25 + lVar23;
            puVar13 = puVar13 + lVar24;
          } while (lVar27 != 0x930);
        }
      }
      else {
        if (iVar17 != 0) {
          lVar27 = iVar17 * stride + lVar18;
          puVar13 = (uint8_t *)((long)(data8 + stride * -2 + lVar27) * 2);
          puVar25 = (uint8_t *)((long)(data8 + stride * -3 + lVar27) * 2);
          if (highbd == 0) {
            puVar13 = data8 + stride * -2 + lVar27;
            puVar25 = data8 + stride * -3 + lVar27;
          }
          memcpy(rlbs,puVar25,__n_00);
          memcpy(puVar25,puVar13,__n_00);
        }
        if (iVar12 < plane_h) {
          lVar27 = (iVar4 + iVar17) * stride + lVar18;
          puVar13 = (uint8_t *)((long)(data8 + lVar23 + lVar27) * 2);
          puVar25 = (uint8_t *)((long)(data8 + stride * 2 + lVar27) * 2);
          if (highbd == 0) {
            puVar13 = data8 + lVar23 + lVar27;
            puVar25 = data8 + stride * 2 + lVar27;
          }
          memcpy(rlbs->tmp_save_below + 2,puVar25,__n_00);
          memcpy(puVar25,puVar13,__n_00);
        }
      }
      (*p_Var3)(rui,iVar10,iVar4,0x40 >> ((byte)ss_x & 0x1f),local_138 + iVar11 * stride,stride,
                __dest + iVar11 * dst_stride,dst_stride,tmpbuf,bit_depth,error_info);
      if (optimized_lr == 0) {
        if (iVar17 != 0) {
          puVar25 = data8 + iVar17 * stride + lVar19;
          puVar13 = (uint8_t *)((long)(data8 + iVar17 * stride + lVar5) * 2);
          lVar27 = 0;
          do {
            puVar20 = puVar13;
            if (highbd == 0) {
              puVar20 = puVar25;
            }
            memcpy(puVar20,(void *)((long)rlbs->tmp_save_above[0] + lVar27),__n);
            lVar27 = lVar27 + 0x310;
            puVar25 = puVar25 + lVar23;
            puVar13 = puVar13 + lVar24;
          } while (lVar27 != 0x930);
        }
        if (iVar12 < plane_h) {
          lVar14 = (long)((iVar17 + iVar4) * stride);
          puVar25 = data8 + lVar14 + lVar18;
          lVar27 = ((long)iVar1 + 3) - (long)(iVar17 + iVar4);
          if (lVar27 < 1) {
            lVar27 = 0;
          }
          puVar13 = (uint8_t *)((long)(data8 + lVar14 + lVar18) * 2);
          lVar14 = 0;
          do {
            if (lVar27 * 0x310 - lVar14 == 0) break;
            puVar20 = puVar13;
            if (highbd == 0) {
              puVar20 = puVar25;
            }
            memcpy(puVar20,(void *)((long)rlbs->tmp_save_below[0] + lVar14),__n);
            lVar14 = lVar14 + 0x310;
            puVar25 = puVar25 + lVar23;
            puVar13 = puVar13 + lVar24;
          } while (lVar14 != 0x930);
        }
      }
      else {
        if (iVar17 != 0) {
          puVar25 = (uint8_t *)((long)(data8 + (long)(iVar17 * stride) + stride * -3 + lVar18) * 2);
          if (highbd == 0) {
            puVar25 = data8 + (long)(iVar17 * stride) + stride * -3 + lVar18;
          }
          memcpy(puVar25,rlbs,__n);
        }
        if ((iVar12 < plane_h) && (iVar17 + iVar4 <= iVar1)) {
          puVar25 = (uint8_t *)
                    ((long)(data8 + (long)((iVar17 + iVar4) * stride) + stride * 2 + lVar18) * 2);
          if (highbd == 0) {
            puVar25 = data8 + (long)((iVar17 + iVar4) * stride) + stride * 2 + lVar18;
          }
          memcpy(puVar25,rlbs->tmp_save_below + 2,__n);
        }
      }
      iVar11 = iVar11 + iVar4;
    } while (iVar11 < (int)uVar21);
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_unit(
    const RestorationTileLimits *limits, const RestorationUnitInfo *rui,
    const RestorationStripeBoundaries *rsb, RestorationLineBuffers *rlbs,
    int plane_w, int plane_h, int ss_x, int ss_y, int highbd, int bit_depth,
    uint8_t *data8, int stride, uint8_t *dst8, int dst_stride, int32_t *tmpbuf,
    int optimized_lr, struct aom_internal_error_info *error_info) {
  RestorationType unit_rtype = rui->restoration_type;

  int unit_h = limits->v_end - limits->v_start;
  int unit_w = limits->h_end - limits->h_start;
  uint8_t *data8_tl =
      data8 + limits->v_start * (ptrdiff_t)stride + limits->h_start;
  uint8_t *dst8_tl =
      dst8 + limits->v_start * (ptrdiff_t)dst_stride + limits->h_start;

  if (unit_rtype == RESTORE_NONE) {
    copy_rest_unit(unit_w, unit_h, data8_tl, stride, dst8_tl, dst_stride,
                   highbd);
    return;
  }

  const int filter_idx = 2 * highbd + (unit_rtype == RESTORE_SGRPROJ);
  assert(filter_idx < NUM_STRIPE_FILTERS);
  const stripe_filter_fun stripe_filter = stripe_filters[filter_idx];

  const int procunit_width = RESTORATION_PROC_UNIT_SIZE >> ss_x;

  // Filter the whole image one stripe at a time
  RestorationTileLimits remaining_stripes = *limits;
  int i = 0;
  while (i < unit_h) {
    int copy_above, copy_below;
    remaining_stripes.v_start = limits->v_start + i;

    get_stripe_boundary_info(&remaining_stripes, plane_w, plane_h, ss_y,
                             &copy_above, &copy_below);

    const int full_stripe_height = RESTORATION_PROC_UNIT_SIZE >> ss_y;
    const int runit_offset = RESTORATION_UNIT_OFFSET >> ss_y;

    // Work out where this stripe's boundaries are within
    // rsb->stripe_boundary_{above,below}
    const int frame_stripe =
        (remaining_stripes.v_start + runit_offset) / full_stripe_height;
    const int rsb_row = RESTORATION_CTX_VERT * frame_stripe;

    // Calculate this stripe's height, based on two rules:
    // * The topmost stripe in the frame is 8 luma pixels shorter than usual.
    // * We can't extend past the end of the current restoration unit
    const int nominal_stripe_height =
        full_stripe_height - ((frame_stripe == 0) ? runit_offset : 0);
    const int h = AOMMIN(nominal_stripe_height,
                         remaining_stripes.v_end - remaining_stripes.v_start);

    setup_processing_stripe_boundary(&remaining_stripes, rsb, rsb_row, highbd,
                                     h, data8, stride, rlbs, copy_above,
                                     copy_below, optimized_lr);

    stripe_filter(rui, unit_w, h, procunit_width, data8_tl + i * stride, stride,
                  dst8_tl + i * dst_stride, dst_stride, tmpbuf, bit_depth,
                  error_info);

    restore_processing_stripe_boundary(&remaining_stripes, rlbs, highbd, h,
                                       data8, stride, copy_above, copy_below,
                                       optimized_lr);

    i += h;
  }
}